

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.cc
# Opt level: O0

void re2c::printSpan(ostream *o,uint32_t lb,uint32_t ub)

{
  uint32_t ub_local;
  uint32_t lb_local;
  ostream *o_local;
  
  std::operator<<(o,"[");
  if (ub - lb == 1) {
    prtChOrHexForSpan(o,lb);
  }
  else {
    prtChOrHexForSpan(o,lb);
    std::operator<<(o,"-");
    prtChOrHexForSpan(o,ub - 1);
  }
  std::operator<<(o,"]");
  return;
}

Assistant:

void printSpan(std::ostream& o, uint32_t lb, uint32_t ub)
{
	o << "[";
	if ((ub - lb) == 1)
	{
		prtChOrHexForSpan(o, lb);
	}
	else
	{
		prtChOrHexForSpan(o, lb);
		o << "-";
		prtChOrHexForSpan(o, ub - 1);
	}
	o << "]";
}